

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
          (tag_t<cfgfile::qstring_trait_t> *this,string_t *name,bool is_mandatory)

{
  this->_vptr_tag_t = (_func_int **)&PTR__tag_t_0011b8f0;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&this->m_name,(QArrayDataPointer<char16_t> *)name);
  this->m_is_mandatory = is_mandatory;
  this->m_is_defined = false;
  (this->m_child_tags).
  super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_child_tags).
  super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_child_tags).
    super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)&this->m_line_number = 0xffffffff;
  *(undefined4 *)((long)&this->m_line_number + 4) = 0xffffffff;
  *(undefined4 *)&this->m_column_number = 0xffffffff;
  *(undefined4 *)((long)&this->m_column_number + 4) = 0xffffffff;
  return;
}

Assistant:

explicit tag_t( const typename Trait::string_t & name,
		bool is_mandatory = false )
		:   m_name( name )
		,   m_is_mandatory( is_mandatory )
		,   m_is_defined( false )
		,	m_parent( nullptr )
		,	m_line_number( -1 )
		,	m_column_number( -1 )
	{
	}